

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O2

void __thiscall
myvk::CommandBuffer::CmdExecuteCommands
          (CommandBuffer *this,
          vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
          *command_buffers)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> handles;
  allocator_type local_29;
  _Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> local_28;
  
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::vector
            ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)&local_28,
             (long)(command_buffers->
                   super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(command_buffers->
                   super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,&local_29);
  uVar1 = 0;
  while( true ) {
    uVar2 = (ulong)uVar1;
    uVar3 = (long)local_28._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28._M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar3 <= uVar2) break;
    local_28._M_impl.super__Vector_impl_data._M_start[uVar2] =
         ((command_buffers->
          super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar2].
          super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_command_buffer;
    uVar1 = uVar1 + 1;
  }
  (*vkCmdExecuteCommands)
            (this->m_command_buffer,(uint32_t)uVar3,
             local_28._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::~_Vector_base
            (&local_28);
  return;
}

Assistant:

void CommandBuffer::CmdExecuteCommands(const std::vector<Ptr<CommandBuffer>> &command_buffers) const {
	std::vector<VkCommandBuffer> handles(command_buffers.size());
	for (uint32_t i = 0; i < handles.size(); ++i)
		handles[i] = command_buffers[i]->GetHandle();
	vkCmdExecuteCommands(m_command_buffer, handles.size(), handles.data());
}